

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSet
          (ExtensionSet *this,CodedInputStream *input,Message *containing_type,
          UnknownFieldSet *unknown_fields)

{
  DescriptorPool *pDVar1;
  MessageFactory *pMVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  UnknownFieldSetFieldSkipper skipper;
  DescriptorPoolExtensionFinder finder;
  FieldSkipper local_50;
  UnknownFieldSet *local_48;
  ExtensionFinder local_40;
  DescriptorPool *local_38;
  MessageFactory *local_30;
  undefined8 local_28;
  
  local_50._vptr_FieldSkipper = (_func_int **)&PTR__FieldSkipper_00296748;
  pDVar1 = input->extension_pool_;
  local_48 = unknown_fields;
  if (pDVar1 == (DescriptorPool *)0x0) {
    local_40._vptr_ExtensionFinder = (_func_int **)&PTR__ExtensionFinder_00295c90;
    local_38 = (DescriptorPool *)containing_type;
    bVar3 = ParseMessageSet(this,input,&local_40,&local_50);
  }
  else {
    pMVar2 = input->extension_factory_;
    iVar4 = (*(containing_type->super_MessageLite)._vptr_MessageLite[0x13])(containing_type);
    local_28 = CONCAT44(extraout_var,iVar4);
    local_40._vptr_ExtensionFinder = (_func_int **)&PTR__ExtensionFinder_00295cd0;
    local_38 = pDVar1;
    local_30 = pMVar2;
    bVar3 = ParseMessageSet(this,input,&local_40,&local_50);
  }
  ExtensionFinder::~ExtensionFinder(&local_40);
  return bVar3;
}

Assistant:

bool ExtensionSet::ParseMessageSet(io::CodedInputStream* input,
                                   const Message* containing_type,
                                   UnknownFieldSet* unknown_fields) {
  UnknownFieldSetFieldSkipper skipper(unknown_fields);
  if (input->GetExtensionPool() == NULL) {
    GeneratedExtensionFinder finder(containing_type);
    return ParseMessageSet(input, &finder, &skipper);
  } else {
    DescriptorPoolExtensionFinder finder(input->GetExtensionPool(),
                                         input->GetExtensionFactory(),
                                         containing_type->GetDescriptor());
    return ParseMessageSet(input, &finder, &skipper);
  }
}